

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_scope_test.cpp
# Opt level: O1

function_return
function_example_interface_await
          (function func,function_impl impl,void **args,size_t size,
          function_resolve_callback resolve_callback,function_reject_callback reject_callback,
          void *context)

{
  return (function_return)0x0;
}

Assistant:

function_return function_example_interface_await(function func, function_impl impl, function_args args, size_t size, function_resolve_callback resolve_callback, function_reject_callback reject_callback, void *context)
{
	/* TODO */

	(void)func;
	(void)impl;
	(void)args;
	(void)size;
	(void)resolve_callback;
	(void)reject_callback;
	(void)context;

	return NULL;
}